

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O1

void av1_iadst8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  long lVar2;
  int32_t *input_00;
  int8_t *piVar3;
  long lVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int32_t step [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int32_t *local_48;
  long local_40;
  int8_t *local_38;
  
  lVar8 = (long)(int)CONCAT71(in_register_00000011,cos_bit);
  lVar9 = lVar8 * 0x100;
  *output = input[7];
  output[1] = *input;
  output[2] = input[5];
  output[3] = input[2];
  output[4] = input[3];
  output[5] = input[4];
  output[6] = input[1];
  output[7] = input[6];
  local_38 = stage_range;
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  piVar3 = local_38;
  local_40 = 1L << (cos_bit - 1U & 0x3f);
  local_68._0_4_ =
       (int)(*output * LoadMaskz2[lVar8 * 8 + 6][4] + local_40 +
             (long)(output[1] * *(int *)(&DAT_00d47570 + lVar9)) >> (cos_bit & 0x3fU));
  local_68._4_4_ =
       (int)(*(int *)(&DAT_00d47570 + lVar9) * *output + local_40 +
             (long)-(LoadMaskz2[lVar8 * 8 + 6][4] * output[1]) >> (cos_bit & 0x3fU));
  uStack_60._0_4_ =
       (int)(output[2] * *(int *)(&DAT_00d474d0 + lVar8 * 0x20) + local_40 +
             (long)(output[3] * *(int *)(&DAT_00d47530 + lVar9)) >> (cos_bit & 0x3fU));
  uStack_60._4_4_ =
       (int)(*(int *)(&DAT_00d47530 + lVar9) * output[2] + local_40 +
             (long)-(*(int *)(&DAT_00d474d0 + lVar8 * 0x20) * output[3]) >> (cos_bit & 0x3fU));
  local_58._0_4_ =
       (int)(output[4] * *(int *)(&DAT_00d47510 + lVar9) + local_40 +
             (long)(output[5] * *(int *)(&DAT_00d474f0 + lVar9)) >> (cos_bit & 0x3fU));
  local_58._4_4_ =
       (int)(*(int *)(&DAT_00d474f0 + lVar9) * output[4] + local_40 +
             (long)-(*(int *)(&DAT_00d47510 + lVar9) * output[5]) >> (cos_bit & 0x3fU));
  local_50 = (int)(output[6] * *(int *)(&DAT_00d47550 + lVar9) + local_40 +
                   (long)(output[7] * LoadMaskz2[lVar8 * 8 + 7][4]) >> (cos_bit & 0x3fU));
  local_4c = (int)(LoadMaskz2[lVar8 * 8 + 7][4] * output[6] + local_40 +
                   (long)-(*(int *)(&DAT_00d47550 + lVar9) * output[7]) >> (cos_bit & 0x3fU));
  local_48 = input;
  av1_range_check_buf(2,input,(int32_t *)&local_68,8,local_38[2]);
  input_00 = local_48;
  iVar7 = (int)local_58 + (int)local_68;
  if ('\0' < piVar3[3]) {
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar4 = (long)iVar7;
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    lVar2 = -lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      lVar2 = lVar5;
    }
    iVar7 = (int)lVar2;
  }
  *output = iVar7;
  iVar7 = local_58._4_4_ + local_68._4_4_;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)iVar7;
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    lVar2 = -lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      lVar2 = lVar5;
    }
    iVar7 = (int)lVar2;
  }
  output[1] = iVar7;
  iVar7 = local_50 + (int)uStack_60;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)iVar7;
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    lVar2 = -lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      lVar2 = lVar5;
    }
    iVar7 = (int)lVar2;
  }
  output[2] = iVar7;
  iVar7 = local_4c + uStack_60._4_4_;
  if ('\0' < piVar3[3]) {
    lVar6 = (long)iVar7;
    lVar4 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar4 + -1;
    if (lVar6 < lVar4 + -1) {
      lVar5 = lVar6;
    }
    iVar7 = (int)-lVar4;
    if (SBORROW8(lVar6,-lVar4) == lVar6 + lVar4 < 0) {
      iVar7 = (int)lVar5;
    }
  }
  output[3] = iVar7;
  iVar7 = (int)local_68 - (int)local_58;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)iVar7;
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    lVar2 = -lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      lVar2 = lVar5;
    }
    iVar7 = (int)lVar2;
  }
  output[4] = iVar7;
  iVar7 = local_68._4_4_ - local_58._4_4_;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)iVar7;
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    lVar2 = -lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      lVar2 = lVar5;
    }
    iVar7 = (int)lVar2;
  }
  output[5] = iVar7;
  iVar7 = (int)uStack_60 - local_50;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)((int)uStack_60 - local_50);
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    iVar7 = (int)-lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      iVar7 = (int)lVar5;
    }
  }
  output[6] = iVar7;
  iVar7 = uStack_60._4_4_ - local_4c;
  if ('\0' < piVar3[3]) {
    lVar4 = (long)(uStack_60._4_4_ - local_4c);
    lVar6 = 1L << (piVar3[3] - 1U & 0x3f);
    lVar5 = lVar6 + -1;
    if (lVar4 < lVar6 + -1) {
      lVar5 = lVar4;
    }
    iVar7 = (int32_t)-lVar6;
    if (SBORROW8(lVar4,-lVar6) == lVar4 + lVar6 < 0) {
      iVar7 = (int32_t)lVar5;
    }
  }
  output[7] = iVar7;
  av1_range_check_buf(3,local_48,output,8,piVar3[3]);
  local_68 = *(undefined8 *)output;
  uStack_60 = *(undefined8 *)(output + 2);
  iVar7 = *(int *)(&DAT_00d474c0 + lVar8 * 0x20);
  iVar1 = *(int *)(&DAT_00d47540 + lVar9);
  local_58._0_4_ =
       (int)(output[4] * iVar7 + local_40 + (long)(output[5] * iVar1) >> (cos_bit & 0x3fU));
  local_58._4_4_ =
       (int)(iVar1 * output[4] + local_40 + (long)-(iVar7 * output[5]) >> (cos_bit & 0x3fU));
  local_50 = (int)(output[7] * iVar7 + local_40 + (long)-(iVar1 * output[6]) >> (cos_bit & 0x3fU));
  local_4c = (int)(output[6] * iVar7 + local_40 + (long)(output[7] * iVar1) >> (cos_bit & 0x3fU));
  av1_range_check_buf(4,input_00,(int32_t *)&local_68,8,piVar3[4]);
  iVar7 = (int)uStack_60 + (int)local_68;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  *output = iVar7;
  iVar7 = uStack_60._4_4_ + local_68._4_4_;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[1] = iVar7;
  iVar7 = (int)local_68 - (int)uStack_60;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[2] = iVar7;
  iVar7 = local_68._4_4_ - uStack_60._4_4_;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)(local_68._4_4_ - uStack_60._4_4_);
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    iVar7 = (int)-lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      iVar7 = (int)lVar8;
    }
  }
  output[3] = iVar7;
  iVar7 = local_50 + (int)local_58;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[4] = iVar7;
  iVar7 = local_4c + local_58._4_4_;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[5] = iVar7;
  iVar7 = (int)local_58 - local_50;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)iVar7;
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    lVar6 = -lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[6] = iVar7;
  iVar7 = local_58._4_4_ - local_4c;
  if ('\0' < piVar3[5]) {
    lVar5 = (long)(local_58._4_4_ - local_4c);
    lVar4 = 1L << (piVar3[5] - 1U & 0x3f);
    lVar8 = lVar4 + -1;
    if (lVar5 < lVar4 + -1) {
      lVar8 = lVar5;
    }
    iVar7 = (int)-lVar4;
    if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
      iVar7 = (int)lVar8;
    }
  }
  output[7] = iVar7;
  av1_range_check_buf(5,input_00,output,8,piVar3[5]);
  local_68 = *(undefined8 *)output;
  iVar7 = *(int *)(&DAT_00d47500 + lVar9);
  lVar8 = (long)output[2] * (long)iVar7 + local_40;
  uStack_60._0_4_ = (int)(output[3] * iVar7 + lVar8 >> (cos_bit & 0x3fU));
  uStack_60._4_4_ = (int)(output[3] * -iVar7 + lVar8 >> (cos_bit & 0x3fU));
  local_58 = *(undefined8 *)(output + 4);
  lVar8 = (long)output[6] * (long)iVar7 + local_40;
  local_50 = (int)(output[7] * iVar7 + lVar8 >> (cos_bit & 0x3fU));
  local_4c = (int)(-iVar7 * output[7] + lVar8 >> (cos_bit & 0x3fU));
  av1_range_check_buf(6,input_00,(int32_t *)&local_68,8,piVar3[6]);
  *output = (int)local_68;
  output[1] = -(int)local_58;
  output[2] = local_50;
  output[3] = -(int)uStack_60;
  output[4] = uStack_60._4_4_;
  output[5] = -local_4c;
  output[6] = local_58._4_4_;
  output[7] = -local_68._4_4_;
  return;
}

Assistant:

void av1_iadst8(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[7];
  bf1[1] = input[0];
  bf1[2] = input[5];
  bf1[3] = input[2];
  bf1[4] = input[3];
  bf1[5] = input[4];
  bf1[6] = input[1];
  bf1[7] = input[6];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[4], bf0[0], cospi[60], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[60], bf0[0], -cospi[4], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[20], bf0[2], cospi[44], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[44], bf0[2], -cospi[20], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[36], bf0[4], cospi[28], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[28], bf0[4], -cospi[36], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[52], bf0[6], cospi[12], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[12], bf0[6], -cospi[52], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[4];
  bf1[2] = bf0[6];
  bf1[3] = -bf0[2];
  bf1[4] = bf0[3];
  bf1[5] = -bf0[7];
  bf1[6] = bf0[5];
  bf1[7] = -bf0[1];
}